

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_viewOps.cpp
# Opt level: O3

void __thiscall
gmlc::utilities::string_viewOps::trimString
          (string_viewOps *this,string_view *input,string_view trimCharacters)

{
  long lVar1;
  ulong uVar2;
  size_type sVar3;
  ulong uVar4;
  
  lVar1 = *(long *)this;
  sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::find_last_not_of
                    ((basic_string_view<char,_std::char_traits<char>_> *)this,
                     (char *)trimCharacters._M_len,0xffffffffffffffff,(size_type)input);
  uVar2 = *(ulong *)this;
  uVar4 = sVar3 + 1;
  if (uVar2 < sVar3 + 1) {
    uVar4 = uVar2;
  }
  *(ulong *)this = (uVar2 - lVar1) + uVar4;
  sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_not_of
                    ((basic_string_view<char,_std::char_traits<char>_> *)this,
                     (char *)trimCharacters._M_len,0,(size_type)input);
  uVar2 = *(ulong *)this;
  if (uVar2 < sVar3) {
    sVar3 = uVar2;
  }
  *(size_type *)(this + 8) = *(long *)(this + 8) + sVar3;
  *(ulong *)this = uVar2 - sVar3;
  return;
}

Assistant:

void trimString(std::string_view& input, std::string_view trimCharacters)
{
    input.remove_suffix(
        input.length() -
        std::min(input.find_last_not_of(trimCharacters) + 1, input.size()));
    input.remove_prefix(
        std::min(input.find_first_not_of(trimCharacters), input.size()));
}